

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O1

void cmdline_cleanup(void)

{
  char *b;
  size_t n;
  long lVar1;
  
  b = cmdline_password;
  if (cmdline_password != (char *)0x0) {
    n = strlen(cmdline_password);
    smemclr(b,n);
    safefree(cmdline_password);
    cmdline_password = (char *)0x0;
  }
  lVar1 = 0;
  do {
    safefree(*(void **)((long)&saves[0].params + lVar1));
    *(undefined8 *)((long)&saves[0].params + lVar1) = 0;
    *(undefined8 *)((long)&saves[0].nsaved + lVar1) = 0;
    *(undefined8 *)((long)&saves[0].savesize + lVar1) = 0;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 == 0x18);
  return;
}

Assistant:

void cmdline_cleanup(void)
{
    int pri;

    if (cmdline_password) {
        smemclr(cmdline_password, strlen(cmdline_password));
        sfree(cmdline_password);
        cmdline_password = NULL;
    }

    for (pri = 0; pri < NPRIORITIES; pri++) {
        sfree(saves[pri].params);
        saves[pri].params = NULL;
        saves[pri].savesize = 0;
        saves[pri].nsaved = 0;
    }
}